

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

float Assimp::getWeightAtKey
                (vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> *values,
                int key,uint value)

{
  pointer pMVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  pMVar1 = (values->
           super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar2 = *(long *)&pMVar1[key].mKeys.
                    super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                    ._M_impl;
  lVar3 = (long)*(pointer *)
                 ((long)&pMVar1[key].mKeys.
                         super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                         ._M_impl + 8) - lVar2;
  if (lVar3 != 0) {
    uVar4 = 1;
    uVar5 = 0;
    do {
      if (*(uint *)(lVar2 + 4 + uVar5 * 8) == value) {
        return *(float *)(lVar2 + uVar5 * 8);
      }
      uVar5 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)(lVar3 >> 3));
  }
  return 0.0;
}

Assistant:

float getWeightAtKey(const std::vector<MorphTimeValues> &values, int key, unsigned int value)
{
    for (unsigned int i = 0; i < values[key].mKeys.size(); i++)
    {
        if (values[key].mKeys[i].mValue == value)
            return values[key].mKeys[i].mWeight;
    }
    // no value at key found, try to interpolate if present at other keys. if not, return zero
    // TODO: interpolation
    return 0.0f;
}